

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

void __thiscall
vkt::rasterization::anon_unknown_0::BaseRenderingTestInstance::addImageTransitionBarrier
          (BaseRenderingTestInstance *this,VkCommandBuffer commandBuffer,VkImage image,
          VkPipelineStageFlags srcStageMask,VkPipelineStageFlags dstStageMask,
          VkAccessFlags srcAccessMask,VkAccessFlags dstAccessMask,VkImageLayout oldLayout,
          VkImageLayout newLayout)

{
  DeviceInterface *pDVar1;
  undefined4 local_98 [2];
  VkImageMemoryBarrier imageBarrier;
  VkImageSubresourceRange subResourcerange;
  DeviceInterface *vkd;
  VkAccessFlags srcAccessMask_local;
  VkPipelineStageFlags dstStageMask_local;
  VkPipelineStageFlags srcStageMask_local;
  VkCommandBuffer commandBuffer_local;
  BaseRenderingTestInstance *this_local;
  VkImage image_local;
  
  pDVar1 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  stack0xffffffffffffffb4 = 1;
  local_98[0] = 0x2d;
  imageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageBarrier._4_4_ = 0;
  imageBarrier.pNext._4_4_ = dstAccessMask;
  imageBarrier.srcAccessMask = oldLayout;
  imageBarrier.dstAccessMask = newLayout;
  imageBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  imageBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  imageBarrier.image.m_internal = 1;
  imageBarrier.subresourceRange.aspectMask = 1;
  imageBarrier.subresourceRange.baseMipLevel = 0;
  imageBarrier.subresourceRange.levelCount = 1;
  imageBarrier.pNext._0_4_ = srcAccessMask;
  imageBarrier._32_8_ = image.m_internal;
  (*pDVar1->_vptr_DeviceInterface[0x6d])
            (pDVar1,commandBuffer,(ulong)srcStageMask,(ulong)dstStageMask,0,0,0,0,0,1,local_98);
  return;
}

Assistant:

void BaseRenderingTestInstance::addImageTransitionBarrier(VkCommandBuffer commandBuffer, VkImage image, VkPipelineStageFlags srcStageMask, VkPipelineStageFlags dstStageMask, VkAccessFlags srcAccessMask, VkAccessFlags dstAccessMask, VkImageLayout oldLayout, VkImageLayout newLayout) const
{

	const DeviceInterface&			vkd					= m_context.getDeviceInterface();

	const VkImageSubresourceRange	subResourcerange	=
	{
		VK_IMAGE_ASPECT_COLOR_BIT,		// VkImageAspectFlags	aspectMask;
		0,								// deUint32				baseMipLevel;
		1,								// deUint32				levelCount;
		0,								// deUint32				baseArrayLayer;
		1								// deUint32				layerCount;
	};

	const VkImageMemoryBarrier		imageBarrier		=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		srcAccessMask,								// VkAccessFlags			srcAccessMask;
		dstAccessMask,								// VkAccessFlags			dstAccessMask;
		oldLayout,									// VkImageLayout			oldLayout;
		newLayout,									// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					destQueueFamilyIndex;
		image,										// VkImage					image;
		subResourcerange							// VkImageSubresourceRange	subresourceRange;
	};

	vkd.cmdPipelineBarrier(commandBuffer, srcStageMask, dstStageMask, 0, 0, DE_NULL, 0, DE_NULL, 1, &imageBarrier);
}